

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O3

int ludp_send(lua_State *L)

{
  int iVar1;
  skynet_context *ctx;
  lua_Integer lVar2;
  char *address;
  void *buffer;
  int sz;
  int local_2c;
  
  ctx = (skynet_context *)lua_touserdata(L,-0xf4629);
  lVar2 = luaL_checkinteger(L,1);
  address = luaL_checklstring(L,2,(size_t *)0x0);
  local_2c = 0;
  buffer = get_buffer(L,3,&local_2c);
  iVar1 = skynet_socket_udp_send(ctx,(int)lVar2,address,buffer,local_2c);
  lua_pushboolean(L,(uint)(iVar1 == 0));
  return 1;
}

Assistant:

static int
ludp_send(lua_State *L) {
	struct skynet_context * ctx = lua_touserdata(L, lua_upvalueindex(1));
	int id = luaL_checkinteger(L, 1);
	const char * address = luaL_checkstring(L, 2);
	int sz = 0;
	void *buffer = get_buffer(L, 3, &sz);
	int err = skynet_socket_udp_send(ctx, id, address, buffer, sz);

	lua_pushboolean(L, !err);

	return 1;
}